

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O0

void clear_elements(void)

{
  int local_c;
  int i;
  
  memset(&head,0,0x10);
  memset(values,0,0x18);
  memset(elements1,0,0x90);
  memset(elements2,0,0x90);
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    elements1[local_c].value = local_c;
    elements2[local_c].value = -local_c;
  }
  return;
}

Assistant:

static void clear_elements(void) {
  int i;

  memset(&head, 0, sizeof(head));
  memset(values, 0, sizeof(values));
  memset(elements1, 0, sizeof(elements1));
  memset(elements2, 0, sizeof(elements2));

  for (i=0; i<COUNT; i++) {
    elements1[i].value = i;
    elements2[i].value = -i;
  }
}